

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O0

void cshutdn_perform(cshutdn *cshutdn,Curl_easy *data)

{
  size_t sVar1;
  Curl_llist_node *pCVar2;
  connectdata *conn_00;
  curltime cVar3;
  undefined4 uStack_64;
  _Bool local_59;
  timediff_t tStack_58;
  _Bool done;
  timediff_t ms;
  timediff_t next_expire_ms;
  curltime now;
  curltime *nowp;
  connectdata *conn;
  Curl_llist_node *enext;
  Curl_llist_node *e;
  Curl_easy *data_local;
  cshutdn *cshutdn_local;
  
  enext = Curl_llist_head(&cshutdn->list);
  now.tv_usec = 0;
  now._12_4_ = 0;
  ms = 0;
  if (enext != (Curl_llist_node *)0x0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_multi.log_level)) {
      sVar1 = Curl_llist_count(&cshutdn->list);
      Curl_trc_multi(data,"[SHUTDOWN] perform on %zu connections",sVar1);
    }
    while (enext != (Curl_llist_node *)0x0) {
      pCVar2 = Curl_node_next(enext);
      conn_00 = (connectdata *)Curl_node_elem(enext);
      Curl_cshutdn_run_once(data,conn_00,&local_59);
      if ((local_59 & 1U) == 0) {
        if (now._8_8_ == 0) {
          cVar3 = Curl_now();
          next_expire_ms = cVar3.tv_sec;
          now.tv_sec = CONCAT44(uStack_64,cVar3.tv_usec);
          now._8_8_ = &next_expire_ms;
        }
        tStack_58 = Curl_conn_shutdown_timeleft(conn_00,(curltime *)now._8_8_);
        enext = pCVar2;
        if ((tStack_58 != 0) && (tStack_58 < ms)) {
          ms = tStack_58;
        }
      }
      else {
        Curl_node_remove(enext);
        Curl_cshutdn_terminate(data,conn_00,false);
        enext = pCVar2;
      }
    }
    if (ms != 0) {
      Curl_expire_ex(data,(curltime *)now._8_8_,ms,EXPIRE_SHUTDOWN);
    }
  }
  return;
}

Assistant:

static void cshutdn_perform(struct cshutdn *cshutdn,
                              struct Curl_easy *data)
{
  struct Curl_llist_node *e = Curl_llist_head(&cshutdn->list);
  struct Curl_llist_node *enext;
  struct connectdata *conn;
  struct curltime *nowp = NULL;
  struct curltime now;
  timediff_t next_expire_ms = 0, ms;
  bool done;

  if(!e)
    return;

  CURL_TRC_M(data, "[SHUTDOWN] perform on %zu connections",
             Curl_llist_count(&cshutdn->list));
  while(e) {
    enext = Curl_node_next(e);
    conn = Curl_node_elem(e);
    Curl_cshutdn_run_once(data, conn, &done);
    if(done) {
      Curl_node_remove(e);
      Curl_cshutdn_terminate(data, conn, FALSE);
    }
    else {
      /* idata has one timer list, but maybe more than one connection.
       * Set EXPIRE_SHUTDOWN to the smallest time left for all. */
      if(!nowp) {
        now = Curl_now();
        nowp = &now;
      }
      ms = Curl_conn_shutdown_timeleft(conn, nowp);
      if(ms && ms < next_expire_ms)
        next_expire_ms = ms;
    }
    e = enext;
  }

  if(next_expire_ms)
    Curl_expire_ex(data, nowp, next_expire_ms, EXPIRE_SHUTDOWN);
}